

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O1

Amount __thiscall
cfd::CoinSelectionOption::GetConfidentialDustFeeAmount(CoinSelectionOption *this,Address *address)

{
  uint32_t size;
  undefined1 auVar1 [12];
  bool bVar2;
  uint32_t uVar3;
  uint64_t baserate;
  Amount AVar4;
  FeeCalculator dust_fee;
  Script locking_script;
  ConfidentialTxOutReference txout;
  ConfidentialTxOut ctxout;
  FeeCalculator local_264;
  ConfidentialValue local_260;
  Script local_238;
  ConfidentialTxOutReference local_200;
  ConfidentialTxOut local_108;
  
  baserate = 3000;
  if (0 < this->dust_fee_rate_) {
    baserate = this->dust_fee_rate_;
  }
  FeeCalculator::FeeCalculator(&local_264,baserate);
  core::Address::GetLockingScript(&local_238,address);
  core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&local_200);
  core::ConfidentialValue::ConfidentialValue(&local_260);
  core::ConfidentialTxOut::ConfidentialTxOut
            (&local_108,&local_238,(ConfidentialAssetId *)&local_200,&local_260);
  local_260._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0087cda8;
  if (local_260.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_260.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_260.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_260.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_200.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__ConfidentialAssetId_0087ccc8;
  if ((void *)local_200.super_AbstractTxOutReference.value_.amount_ != (void *)0x0) {
    operator_delete((void *)local_200.super_AbstractTxOutReference.value_.amount_,
                    (long)local_200.super_AbstractTxOutReference.locking_script_._vptr_Script -
                    local_200.super_AbstractTxOutReference.value_.amount_);
  }
  core::ConfidentialTxOutReference::ConfidentialTxOutReference(&local_200,&local_108);
  uVar3 = core::ConfidentialTxOutReference::GetSerializeVsize
                    (&local_200,true,0,0x34,(uint32_t *)0x0,0);
  bVar2 = core::Script::IsWitnessProgram(&local_238);
  size = uVar3 + 0x43;
  if (!bVar2) {
    size = uVar3 + 0x94;
  }
  AVar4 = FeeCalculator::GetFee(&local_264,size);
  core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_200);
  core::ConfidentialTxOut::~ConfidentialTxOut(&local_108);
  core::Script::~Script(&local_238);
  auVar1 = AVar4._0_12_;
  AVar4._12_4_ = 0;
  AVar4.amount_ = auVar1._0_8_;
  AVar4.ignore_check_ = (bool)auVar1[8];
  AVar4._9_3_ = auVar1._9_3_;
  return AVar4;
}

Assistant:

Amount CoinSelectionOption::GetConfidentialDustFeeAmount(
    const Address& address) const {
  FeeCalculator dust_fee(
      (dust_fee_rate_ <= 0) ? kDustRelayTxFeeRate : dust_fee_rate_);
  Script locking_script = address.GetLockingScript();
  ConfidentialTxOut ctxout(
      locking_script, ConfidentialAssetId(), ConfidentialValue());
  ConfidentialTxOutReference txout(ctxout);
  uint32_t size = txout.GetSerializeVsize(true);

  // Reference: bitcoin/src/policy/policy.cpp : GetDustThreshold()
  if (locking_script.IsWitnessProgram()) {
    // sum the sizes of the parts of a transaction input
    // with 75% segwit discount applied to the script size.
    size += (32 + 4 + 1 + (107 / kWitnessScaleFactor) + 4);
  } else {
    size += (32 + 4 + 1 + 107 + 4);  // the 148 mentioned above
  }
  return dust_fee.GetFee(size);
}